

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsWellKnownMessage(FileDescriptor *file)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  allocator local_1ac;
  allocator local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  allocator local_1a8;
  allocator local_1a7;
  allocator local_1a6;
  allocator local_1a5;
  allocator local_1a4;
  allocator local_1a3;
  allocator local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::well_known_files_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                                 well_known_files_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(local_1a0,"google/protobuf/any.proto",&local_1a1);
      std::__cxx11::string::string(local_180,"google/protobuf/api.proto",&local_1a2);
      std::__cxx11::string::string(local_160,"google/protobuf/compiler/plugin.proto",&local_1a3);
      std::__cxx11::string::string(local_140,"google/protobuf/descriptor.proto",&local_1a4);
      std::__cxx11::string::string(local_120,"google/protobuf/duration.proto",&local_1a5);
      std::__cxx11::string::string(local_100,"google/protobuf/empty.proto",&local_1a6);
      std::__cxx11::string::string(local_e0,"google/protobuf/field_mask.proto",&local_1a7);
      std::__cxx11::string::string(local_c0,"google/protobuf/source_context.proto",&local_1a8);
      std::__cxx11::string::string(local_a0,"google/protobuf/struct.proto",&local_1a9);
      std::__cxx11::string::string(local_80,"google/protobuf/timestamp.proto",&local_1aa);
      std::__cxx11::string::string(local_60,"google/protobuf/type.proto",&local_1ab);
      std::__cxx11::string::string(local_40,"google/protobuf/wrappers.proto",&local_1ac);
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                     well_known_files_abi_cxx11_,local_1a0,&stack0xffffffffffffffe0,0,&local_1ad,
                 &local_1ae,&local_1af);
      lVar3 = 0x160;
      do {
        std::__cxx11::string::~string(local_1a0 + lVar3);
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                    well_known_files_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                           well_known_files_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                  well_known_files_abi_cxx11_._M_h,*(key_type **)file);
  return cVar2.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool IsWellKnownMessage(const FileDescriptor* file) {
  static const std::unordered_set<std::string> well_known_files{
      "google/protobuf/any.proto",
      "google/protobuf/api.proto",
      "google/protobuf/compiler/plugin.proto",
      "google/protobuf/descriptor.proto",
      "google/protobuf/duration.proto",
      "google/protobuf/empty.proto",
      "google/protobuf/field_mask.proto",
      "google/protobuf/source_context.proto",
      "google/protobuf/struct.proto",
      "google/protobuf/timestamp.proto",
      "google/protobuf/type.proto",
      "google/protobuf/wrappers.proto",
  };
  return well_known_files.find(file->name()) != well_known_files.end();
}